

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

string * __thiscall
glcts::ArraysOfArrays::TestCaseBase<glcts::ArraysOfArrays::Interface::ES>::extend_string
          (string *__return_storage_ptr__,TestCaseBase<glcts::ArraysOfArrays::Interface::ES> *this,
          string *base_string,string *sub_string,size_t number_of_elements)

{
  bool bVar1;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)base_string);
  while (bVar1 = number_of_elements != 0, number_of_elements = number_of_elements - 1, bVar1) {
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TestCaseBase<API>::extend_string(std::string base_string, std::string sub_string, size_t number_of_elements)
{
	std::string temp_string = base_string;

	for (size_t sub_script_index = 0; sub_script_index < number_of_elements; sub_script_index++)
	{
		temp_string += sub_string;
	}

	return temp_string;
}